

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_get_toStringTag(JSContext *ctx,JSValue this_val)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  JSValue JVar5;
  int64_t iVar4;
  
  iVar4 = 3;
  if (((int)this_val.tag == -1) &&
     (uVar1 = *(ushort *)((long)this_val.u.ptr + 6), (ushort)(uVar1 - 0x15) < 9)) {
    JVar5 = JS_AtomToString(ctx,ctx->rt->class_array[uVar1].class_name);
    iVar4 = JVar5.tag;
    uVar3 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
    uVar2 = (ulong)JVar5.u._0_4_;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
  }
  JVar5.u.ptr = (void *)(uVar2 | uVar3);
  JVar5.tag = iVar4;
  return JVar5;
}

Assistant:

static JSValue js_typed_array_get_toStringTag(JSContext *ctx,
                                              JSValueConst this_val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(this_val) != JS_TAG_OBJECT)
        return JS_UNDEFINED;
    p = JS_VALUE_GET_OBJ(this_val);
    if (!(p->class_id >= JS_CLASS_UINT8C_ARRAY &&
          p->class_id <= JS_CLASS_FLOAT64_ARRAY))
        return JS_UNDEFINED;
    return JS_AtomToString(ctx, ctx->rt->class_array[p->class_id].class_name);
}